

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O0

Factor * __thiscall libDAI::MaxPlus::beliefV(MaxPlus *this,size_t i)

{
  bool bVar1;
  long *plVar2;
  Var *pVVar3;
  TProb<double> *this_00;
  NormType extraout_var;
  TFactor<double> *this_01;
  MaxPlus *in_RDX;
  long *in_RSI;
  Factor *in_RDI;
  nb_cit I;
  Prob prod;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff28;
  FactorGraph *in_stack_ffffffffffffff30;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff38;
  MaxPlus *in_stack_ffffffffffffff40;
  VarSet *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff58;
  NormType norm;
  TProb<double> *in_stack_ffffffffffffff60;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38 [4];
  MaxPlus *local_18;
  
  local_18 = in_RDX;
  plVar2 = (long *)(**(code **)(*in_RSI + 0x20))();
  pVVar3 = (Var *)(**(code **)(*plVar2 + 0x30))(plVar2,local_18);
  Var::states(pVVar3);
  TProb<double>::TProb(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  (**(code **)(*in_RSI + 0x20))();
  this_00 = (TProb<double> *)
            FactorGraph::nbV(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
  local_38[0]._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff28);
  while( true ) {
    (**(code **)(*in_RSI + 0x20))();
    norm = extraout_var;
    this_01 = (TFactor<double> *)
              FactorGraph::nbV(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff30,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    in_stack_ffffffffffffff40 = local_18;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(local_38);
    in_stack_ffffffffffffff48 =
         (VarSet *)
         newMessage(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,
                    (size_t)in_stack_ffffffffffffff30);
    TProb<double>::operator*=((TProb<double> *)this_01,(TProb<double> *)in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  }
  TProb<double>::normalize(this_00,norm);
  pVVar3 = (Var *)(**(code **)(*in_RSI + 0x20))();
  (**(code **)(pVVar3->_label + 0x30))(pVVar3,local_18);
  VarSet::VarSet((VarSet *)in_stack_ffffffffffffff40,pVVar3);
  TFactor<double>::TFactor
            (this_01,in_stack_ffffffffffffff48,(TProb<double> *)in_stack_ffffffffffffff40);
  VarSet::~VarSet((VarSet *)0xbb360e);
  TProb<double>::~TProb((TProb<double> *)0xbb361b);
  return in_RDI;
}

Assistant:

Factor MaxPlus::beliefV( size_t i ) const {
        Prob prod( grm().var(i).states() ); 
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ ) 
            prod *= newMessage(i,*I);

        prod.normalize();
        return( Factor( grm().var(i), prod ) );
    }